

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O1

int64_t av1_highbd_pixel_proj_error_sse4_1
                  (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
                  int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int *xq,
                  sgr_params_type *params)

{
  short *psVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  short *psVar6;
  ushort uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  int iVar21;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_XMM3 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar29 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  
  lVar10 = (long)src8 * 2;
  lVar11 = (long)dat8 * 2;
  iVar14 = params->r[0];
  if (iVar14 < 1) {
LAB_0042dbf8:
    if (params->r[1] < 1) {
      iVar14 = 0;
      if (0 < height) {
        lVar17 = 0;
        lVar18 = 0;
        lVar8 = 0;
        do {
          uVar13 = 0;
          auVar22 = (undefined1  [16])0x0;
          if (0xf < width) {
            lVar12 = 0;
            do {
              in_XMM3 = *(undefined1 (*) [16])(lVar10 + lVar12 * 2);
              psVar6 = (short *)(lVar10 + 0x10 + lVar12 * 2);
              psVar1 = (short *)(lVar11 + lVar12 * 2);
              auVar24._0_2_ = *psVar1 - in_XMM3._0_2_;
              auVar24._2_2_ = psVar1[1] - in_XMM3._2_2_;
              auVar24._4_2_ = psVar1[2] - in_XMM3._4_2_;
              auVar24._6_2_ = psVar1[3] - in_XMM3._6_2_;
              auVar24._8_2_ = psVar1[4] - in_XMM3._8_2_;
              auVar24._10_2_ = psVar1[5] - in_XMM3._10_2_;
              auVar24._12_2_ = psVar1[6] - in_XMM3._12_2_;
              auVar24._14_2_ = psVar1[7] - in_XMM3._14_2_;
              auVar24 = pmaddwd(auVar24,auVar24);
              iVar15 = auVar22._4_4_;
              iVar21 = auVar22._8_4_;
              iVar9 = auVar22._12_4_;
              psVar1 = (short *)(lVar11 + 0x10 + lVar12 * 2);
              auVar20._0_2_ = *psVar1 - *psVar6;
              auVar20._2_2_ = psVar1[1] - psVar6[1];
              auVar20._4_2_ = psVar1[2] - psVar6[2];
              auVar20._6_2_ = psVar1[3] - psVar6[3];
              auVar20._8_2_ = psVar1[4] - psVar6[4];
              auVar20._10_2_ = psVar1[5] - psVar6[5];
              auVar20._12_2_ = psVar1[6] - psVar6[6];
              auVar20._14_2_ = psVar1[7] - psVar6[7];
              auVar20 = pmaddwd(auVar20,auVar20);
              auVar22._0_4_ = auVar20._0_4_ + auVar24._0_4_ + auVar22._0_4_;
              auVar22._4_4_ = auVar20._4_4_ + auVar24._4_4_ + iVar15;
              auVar22._8_4_ = auVar20._8_4_ + auVar24._8_4_ + iVar21;
              auVar22._12_4_ = auVar20._12_4_ + auVar24._12_4_ + iVar9;
              lVar12 = lVar12 + 0x10;
            } while (lVar12 <= (int)(width - 0x10U));
            uVar13 = (ulong)((width - 0x10U & 0xfffffff0) + 0x10);
          }
          iVar15 = (int)uVar13;
          while (iVar15 < width) {
            lVar12 = (ulong)*(ushort *)(lVar11 + uVar13 * 2) -
                     (ulong)*(ushort *)(lVar10 + uVar13 * 2);
            lVar8 = lVar8 + lVar12 * lVar12;
            uVar13 = uVar13 + 1;
            iVar15 = (int)uVar13;
          }
          in_XMM3 = pmovzxdq(in_XMM3,auVar22);
          lVar17 = lVar17 + in_XMM3._0_8_ + (ulong)auVar22._8_4_;
          lVar18 = lVar18 + in_XMM3._8_8_ + (ulong)auVar22._12_4_;
          iVar14 = iVar14 + 1;
          lVar11 = lVar11 + (long)dat_stride * 2;
          lVar10 = lVar10 + (long)src_stride * 2;
        } while (iVar14 != height);
        goto LAB_0042de42;
      }
    }
    else {
LAB_0042dc03:
      iVar15 = 0;
      if (0 < height) {
        iVar21 = xq[iVar14 < 1];
        auVar29._4_4_ = iVar21;
        auVar29._0_4_ = iVar21;
        auVar29._8_4_ = iVar21;
        auVar29._12_4_ = iVar21;
        iVar9 = iVar21 * -0x10;
        if (0 < iVar14) {
          flt1 = flt0;
          flt1_stride = flt0_stride;
        }
        auVar32._4_4_ = iVar9;
        auVar32._0_4_ = iVar9;
        auVar32._8_4_ = iVar9;
        auVar32._12_4_ = iVar9;
        auVar22 = pmovsxwd(in_XMM4,0x400040004000400);
        lVar17 = 0;
        lVar18 = 0;
        lVar8 = 0;
        do {
          uVar13 = 0;
          auVar36 = (undefined1  [16])0x0;
          if (7 < width) {
            lVar12 = 0;
            auVar20 = auVar36;
            do {
              psVar1 = (short *)(lVar10 + lVar12 * 2);
              auVar24 = *(undefined1 (*) [16])(lVar11 + lVar12 * 2);
              auVar28._2_2_ = 0;
              auVar28._0_2_ = auVar24._8_2_;
              auVar28._4_2_ = auVar24._10_2_;
              auVar28._6_2_ = 0;
              auVar28._8_2_ = auVar24._12_2_;
              auVar28._10_2_ = 0;
              auVar28._12_2_ = auVar24._14_2_;
              auVar28._14_2_ = 0;
              auVar38 = pmovzxwd(in_XMM9,auVar24);
              auVar33 = pmulld(*(undefined1 (*) [16])(flt1 + lVar12 + 4),auVar29);
              auVar30 = pmulld(*(undefined1 (*) [16])(flt1 + lVar12),auVar29);
              auVar36 = pmulld(auVar28,auVar32);
              in_XMM9 = pmulld(auVar38,auVar32);
              auVar34._0_4_ = auVar33._0_4_ + auVar22._0_4_ + auVar36._0_4_ >> 0xb;
              auVar34._4_4_ = auVar33._4_4_ + auVar22._4_4_ + auVar36._4_4_ >> 0xb;
              auVar34._8_4_ = auVar33._8_4_ + auVar22._8_4_ + auVar36._8_4_ >> 0xb;
              auVar34._12_4_ = auVar33._12_4_ + auVar22._12_4_ + auVar36._12_4_ >> 0xb;
              auVar33._0_4_ = auVar30._0_4_ + auVar22._0_4_ + in_XMM9._0_4_ >> 0xb;
              auVar33._4_4_ = auVar30._4_4_ + auVar22._4_4_ + in_XMM9._4_4_ >> 0xb;
              auVar33._8_4_ = auVar30._8_4_ + auVar22._8_4_ + in_XMM9._8_4_ >> 0xb;
              auVar33._12_4_ = auVar30._12_4_ + auVar22._12_4_ + in_XMM9._12_4_ >> 0xb;
              auVar36 = packssdw(auVar33,auVar34);
              auVar38._0_2_ = (auVar24._0_2_ - *psVar1) + auVar36._0_2_;
              auVar38._2_2_ = (auVar24._2_2_ - psVar1[1]) + auVar36._2_2_;
              auVar38._4_2_ = (auVar24._4_2_ - psVar1[2]) + auVar36._4_2_;
              auVar38._6_2_ = (auVar24._6_2_ - psVar1[3]) + auVar36._6_2_;
              auVar38._8_2_ = (auVar24._8_2_ - psVar1[4]) + auVar36._8_2_;
              auVar38._10_2_ = (auVar24._10_2_ - psVar1[5]) + auVar36._10_2_;
              auVar38._12_2_ = (auVar24._12_2_ - psVar1[6]) + auVar36._12_2_;
              auVar38._14_2_ = (auVar24._14_2_ - psVar1[7]) + auVar36._14_2_;
              in_XMM6 = pmaddwd(auVar38,auVar38);
              auVar36._0_4_ = auVar20._0_4_ + in_XMM6._0_4_;
              auVar36._4_4_ = auVar20._4_4_ + in_XMM6._4_4_;
              auVar36._8_4_ = auVar20._8_4_ + in_XMM6._8_4_;
              auVar36._12_4_ = auVar20._12_4_ + in_XMM6._12_4_;
              lVar12 = lVar12 + 8;
              auVar20 = auVar36;
            } while (lVar12 <= (int)(width - 8U));
            uVar13 = (ulong)((width - 8U & 0xfffffff8) + 8);
          }
          iVar14 = (int)uVar13;
          while (iVar14 < width) {
            uVar16 = (uint)*(ushort *)(lVar11 + uVar13 * 2);
            lVar12 = (long)(int)((uVar16 - *(ushort *)(lVar10 + uVar13 * 2)) +
                                ((int)((flt1[uVar13] + uVar16 * -0x10) * iVar21 + 0x400) >> 0xb));
            lVar8 = lVar8 + lVar12 * lVar12;
            uVar13 = uVar13 + 1;
            iVar14 = (int)uVar13;
          }
          in_XMM6 = pmovzxdq(in_XMM6,auVar36);
          lVar17 = lVar17 + in_XMM6._0_8_ + (ulong)auVar36._8_4_;
          lVar18 = lVar18 + in_XMM6._8_8_ + (ulong)auVar36._12_4_;
          iVar15 = iVar15 + 1;
          flt1 = flt1 + flt1_stride;
          lVar11 = lVar11 + (long)dat_stride * 2;
          lVar10 = lVar10 + (long)src_stride * 2;
        } while (iVar15 != height);
        goto LAB_0042de42;
      }
    }
  }
  else {
    if (params->r[1] < 1) {
      if (iVar14 < 1) goto LAB_0042dbf8;
      goto LAB_0042dc03;
    }
    iVar14 = 0;
    if (0 < height) {
      iVar15 = *xq;
      iVar21 = xq[1];
      auVar30._4_4_ = iVar15;
      auVar30._0_4_ = iVar15;
      auVar30._8_4_ = iVar15;
      auVar30._12_4_ = iVar15;
      auVar19._4_4_ = iVar21;
      auVar19._0_4_ = iVar21;
      auVar19._8_4_ = iVar21;
      auVar19._12_4_ = iVar21;
      auVar22 = pmovsxwd(in_XMM4,0x400040004000400);
      lVar17 = 0;
      lVar18 = 0;
      lVar8 = 0;
      do {
        uVar13 = 0;
        auVar23 = (undefined1  [16])0x0;
        if (7 < width) {
          lVar12 = 0;
          auVar20 = auVar23;
          do {
            psVar1 = (short *)(lVar10 + lVar12 * 2);
            auVar24 = *(undefined1 (*) [16])(lVar11 + lVar12 * 2);
            auVar29 = psllw(auVar24,4);
            in_XMM10 = pmovzxwd(in_XMM10,auVar29);
            piVar2 = flt0 + lVar12;
            piVar4 = flt0 + lVar12 + 4;
            piVar3 = flt1 + lVar12;
            piVar5 = flt1 + lVar12 + 4;
            auVar31._0_4_ = *piVar2 - in_XMM10._0_4_;
            auVar31._4_4_ = piVar2[1] - in_XMM10._4_4_;
            auVar31._8_4_ = piVar2[2] - in_XMM10._8_4_;
            auVar31._12_4_ = piVar2[3] - in_XMM10._12_4_;
            auVar35._0_4_ = *piVar4 - (uint)auVar29._8_2_;
            auVar35._4_4_ = piVar4[1] - (uint)auVar29._10_2_;
            auVar35._8_4_ = piVar4[2] - (uint)auVar29._12_2_;
            auVar35._12_4_ = piVar4[3] - (uint)auVar29._14_2_;
            auVar26._0_4_ = *piVar3 - in_XMM10._0_4_;
            auVar26._4_4_ = piVar3[1] - in_XMM10._4_4_;
            auVar26._8_4_ = piVar3[2] - in_XMM10._8_4_;
            auVar26._12_4_ = piVar3[3] - in_XMM10._12_4_;
            auVar37._0_4_ = *piVar5 - (uint)auVar29._8_2_;
            auVar37._4_4_ = piVar5[1] - (uint)auVar29._10_2_;
            auVar37._8_4_ = piVar5[2] - (uint)auVar29._12_2_;
            auVar37._12_4_ = piVar5[3] - (uint)auVar29._14_2_;
            auVar32 = pmulld(auVar31,auVar30);
            auVar36 = pmulld(auVar35,auVar30);
            auVar29 = pmulld(auVar26,auVar19);
            auVar38 = pmulld(auVar37,auVar19);
            auVar27._0_4_ = auVar29._0_4_ + auVar32._0_4_ + auVar22._0_4_ >> 0xb;
            auVar27._4_4_ = auVar29._4_4_ + auVar32._4_4_ + auVar22._4_4_ >> 0xb;
            auVar27._8_4_ = auVar29._8_4_ + auVar32._8_4_ + auVar22._8_4_ >> 0xb;
            auVar27._12_4_ = auVar29._12_4_ + auVar32._12_4_ + auVar22._12_4_ >> 0xb;
            auVar39._0_4_ = auVar38._0_4_ + auVar36._0_4_ + auVar22._0_4_ >> 0xb;
            auVar39._4_4_ = auVar38._4_4_ + auVar36._4_4_ + auVar22._4_4_ >> 0xb;
            auVar39._8_4_ = auVar38._8_4_ + auVar36._8_4_ + auVar22._8_4_ >> 0xb;
            auVar39._12_4_ = auVar38._12_4_ + auVar36._12_4_ + auVar22._12_4_ >> 0xb;
            auVar29 = packssdw(auVar27,auVar39);
            auVar25._0_2_ = (auVar24._0_2_ - *psVar1) + auVar29._0_2_;
            auVar25._2_2_ = (auVar24._2_2_ - psVar1[1]) + auVar29._2_2_;
            auVar25._4_2_ = (auVar24._4_2_ - psVar1[2]) + auVar29._4_2_;
            auVar25._6_2_ = (auVar24._6_2_ - psVar1[3]) + auVar29._6_2_;
            auVar25._8_2_ = (auVar24._8_2_ - psVar1[4]) + auVar29._8_2_;
            auVar25._10_2_ = (auVar24._10_2_ - psVar1[5]) + auVar29._10_2_;
            auVar25._12_2_ = (auVar24._12_2_ - psVar1[6]) + auVar29._12_2_;
            auVar25._14_2_ = (auVar24._14_2_ - psVar1[7]) + auVar29._14_2_;
            in_XMM6 = pmaddwd(auVar25,auVar25);
            auVar23._0_4_ = auVar20._0_4_ + in_XMM6._0_4_;
            auVar23._4_4_ = auVar20._4_4_ + in_XMM6._4_4_;
            auVar23._8_4_ = auVar20._8_4_ + in_XMM6._8_4_;
            auVar23._12_4_ = auVar20._12_4_ + in_XMM6._12_4_;
            lVar12 = lVar12 + 8;
            auVar20 = auVar23;
          } while (lVar12 <= (int)(width - 8U));
          uVar13 = (ulong)((width - 8U & 0xfffffff8) + 8);
        }
        iVar9 = (int)uVar13;
        while (iVar9 < width) {
          uVar7 = *(ushort *)(lVar11 + uVar13 * 2);
          lVar12 = (long)(int)(((uint)uVar7 - (uint)*(ushort *)(lVar10 + uVar13 * 2)) +
                              ((int)((flt1[uVar13] + (uint)uVar7 * -0x10) * iVar21 +
                                     (flt0[uVar13] + (uint)uVar7 * -0x10) * iVar15 + 0x400) >> 0xb))
          ;
          lVar8 = lVar8 + lVar12 * lVar12;
          uVar13 = uVar13 + 1;
          iVar9 = (int)uVar13;
        }
        in_XMM6 = pmovzxdq(in_XMM6,auVar23);
        lVar17 = lVar17 + in_XMM6._0_8_ + (ulong)auVar23._8_4_;
        lVar18 = lVar18 + in_XMM6._8_8_ + (ulong)auVar23._12_4_;
        iVar14 = iVar14 + 1;
        flt1 = flt1 + flt1_stride;
        flt0 = flt0 + flt0_stride;
        lVar11 = lVar11 + (long)dat_stride * 2;
        lVar10 = lVar10 + (long)src_stride * 2;
      } while (iVar14 != height);
      goto LAB_0042de42;
    }
  }
  lVar17 = 0;
  lVar18 = 0;
  lVar8 = 0;
LAB_0042de42:
  return lVar18 + lVar17 + lVar8;
}

Assistant:

int64_t av1_highbd_pixel_proj_error_sse4_1(
    const uint8_t *src8, int width, int height, int src_stride,
    const uint8_t *dat8, int dat_stride, int32_t *flt0, int flt0_stride,
    int32_t *flt1, int flt1_stride, int xq[2], const sgr_params_type *params) {
  int i, j, k;
  const int32_t shift = SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS;
  const __m128i rounding = _mm_set1_epi32(1 << (shift - 1));
  __m128i sum64 = _mm_setzero_si128();
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *dat = CONVERT_TO_SHORTPTR(dat8);
  int64_t err = 0;
  if (params->r[0] > 0 && params->r[1] > 0) {  // Both filters are enabled
    const __m128i xq0 = _mm_set1_epi32(xq[0]);
    const __m128i xq1 = _mm_set1_epi32(xq[1]);

    for (i = 0; i < height; ++i) {
      __m128i sum32 = _mm_setzero_si128();
      for (j = 0; j <= width - 8; j += 8) {
        // Load 8x pixels from source image
        const __m128i s0 = xx_loadu_128(src + j);
        // s0 = [7 6 5 4 3 2 1 0] as i16 (indices of src[])

        // Load 8x pixels from corrupted image
        const __m128i d0 = xx_loadu_128(dat + j);
        // d0 = [7 6 5 4 3 2 1 0] as i16 (indices of dat[])

        // Shift each pixel value up by SGRPROJ_RST_BITS
        const __m128i u0 = _mm_slli_epi16(d0, SGRPROJ_RST_BITS);

        // Split u0 into two halves and pad each from u16 to i32
        const __m128i u0l = _mm_cvtepu16_epi32(u0);
        const __m128i u0h = _mm_cvtepu16_epi32(_mm_srli_si128(u0, 8));
        // u0h = [7 6 5 4] as i32, u0l = [3 2 1 0] as i32, all dat[] indices

        // Load 8 pixels from first and second filtered images
        const __m128i flt0l = xx_loadu_128(flt0 + j);
        const __m128i flt0h = xx_loadu_128(flt0 + j + 4);
        const __m128i flt1l = xx_loadu_128(flt1 + j);
        const __m128i flt1h = xx_loadu_128(flt1 + j + 4);
        // flt0 = [7 6 5 4] [3 2 1 0] as i32 (indices of flt0+j)
        // flt1 = [7 6 5 4] [3 2 1 0] as i32 (indices of flt1+j)

        // Subtract shifted corrupt image from each filtered image
        // This gives our two basis vectors for the projection
        const __m128i flt0l_subu = _mm_sub_epi32(flt0l, u0l);
        const __m128i flt0h_subu = _mm_sub_epi32(flt0h, u0h);
        const __m128i flt1l_subu = _mm_sub_epi32(flt1l, u0l);
        const __m128i flt1h_subu = _mm_sub_epi32(flt1h, u0h);
        // flt?h_subu = [ f[7]-u[7] f[6]-u[6] f[5]-u[5] f[4]-u[4] ] as i32
        // flt?l_subu = [ f[3]-u[3] f[2]-u[2] f[1]-u[1] f[0]-u[0] ] as i32

        // Multiply each basis vector by the corresponding coefficient
        const __m128i v0l = _mm_mullo_epi32(flt0l_subu, xq0);
        const __m128i v0h = _mm_mullo_epi32(flt0h_subu, xq0);
        const __m128i v1l = _mm_mullo_epi32(flt1l_subu, xq1);
        const __m128i v1h = _mm_mullo_epi32(flt1h_subu, xq1);

        // Add together the contribution from each scaled basis vector
        const __m128i vl = _mm_add_epi32(v0l, v1l);
        const __m128i vh = _mm_add_epi32(v0h, v1h);

        // Right-shift v with appropriate rounding
        const __m128i vrl = _mm_srai_epi32(_mm_add_epi32(vl, rounding), shift);
        const __m128i vrh = _mm_srai_epi32(_mm_add_epi32(vh, rounding), shift);

        // Saturate each i32 value to i16 and combine lower and upper halves
        const __m128i vr = _mm_packs_epi32(vrl, vrh);

        // Add twin-subspace-sgr-filter to corrupt image then subtract source
        const __m128i e0 = _mm_sub_epi16(_mm_add_epi16(vr, d0), s0);

        // Calculate squared error and add adjacent values
        const __m128i err0 = _mm_madd_epi16(e0, e0);

        sum32 = _mm_add_epi32(sum32, err0);
      }

      const __m128i sum32l = _mm_cvtepu32_epi64(sum32);
      sum64 = _mm_add_epi64(sum64, sum32l);
      const __m128i sum32h = _mm_cvtepu32_epi64(_mm_srli_si128(sum32, 8));
      sum64 = _mm_add_epi64(sum64, sum32h);

      // Process remaining pixels in this row (modulo 8)
      for (k = j; k < width; ++k) {
        const int32_t u = (int32_t)(dat[k] << SGRPROJ_RST_BITS);
        int32_t v = xq[0] * (flt0[k] - u) + xq[1] * (flt1[k] - u);
        const int32_t e = ROUND_POWER_OF_TWO(v, shift) + dat[k] - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt0 += flt0_stride;
      flt1 += flt1_stride;
    }
  } else if (params->r[0] > 0 || params->r[1] > 0) {  // Only one filter enabled
    const int32_t xq_on = (params->r[0] > 0) ? xq[0] : xq[1];
    const __m128i xq_active = _mm_set1_epi32(xq_on);
    const __m128i xq_inactive =
        _mm_set1_epi32(-xq_on * (1 << SGRPROJ_RST_BITS));
    const int32_t *flt = (params->r[0] > 0) ? flt0 : flt1;
    const int flt_stride = (params->r[0] > 0) ? flt0_stride : flt1_stride;
    for (i = 0; i < height; ++i) {
      __m128i sum32 = _mm_setzero_si128();
      for (j = 0; j <= width - 8; j += 8) {
        // Load 8x pixels from source image
        const __m128i s0 = xx_loadu_128(src + j);
        // s0 = [7 6 5 4 3 2 1 0] as u16 (indices of src[])

        // Load 8x pixels from corrupted image and pad each u16 to i32
        const __m128i d0 = xx_loadu_128(dat + j);
        const __m128i d0h = _mm_cvtepu16_epi32(_mm_srli_si128(d0, 8));
        const __m128i d0l = _mm_cvtepu16_epi32(d0);
        // d0h, d0l = [7 6 5 4], [3 2 1 0] as u32 (indices of dat[])

        // Load 8 pixels from the filtered image
        const __m128i flth = xx_loadu_128(flt + j + 4);
        const __m128i fltl = xx_loadu_128(flt + j);
        // flth, fltl = [7 6 5 4], [3 2 1 0] as i32 (indices of flt+j)

        const __m128i flth_xq = _mm_mullo_epi32(flth, xq_active);
        const __m128i fltl_xq = _mm_mullo_epi32(fltl, xq_active);
        const __m128i d0h_xq = _mm_mullo_epi32(d0h, xq_inactive);
        const __m128i d0l_xq = _mm_mullo_epi32(d0l, xq_inactive);

        const __m128i vh = _mm_add_epi32(flth_xq, d0h_xq);
        const __m128i vl = _mm_add_epi32(fltl_xq, d0l_xq);
        // vh = [ xq0(f[7]-d[7]) xq0(f[6]-d[6]) xq0(f[5]-d[5]) xq0(f[4]-d[4]) ]
        // vl = [ xq0(f[3]-d[3]) xq0(f[2]-d[2]) xq0(f[1]-d[1]) xq0(f[0]-d[0]) ]

        // Shift this down with appropriate rounding
        const __m128i vrh = _mm_srai_epi32(_mm_add_epi32(vh, rounding), shift);
        const __m128i vrl = _mm_srai_epi32(_mm_add_epi32(vl, rounding), shift);

        // Saturate vr0 and vr1 from i32 to i16 then pack together
        const __m128i vr = _mm_packs_epi32(vrl, vrh);

        // Subtract twin-subspace-sgr filtered from source image to get error
        const __m128i e0 = _mm_sub_epi16(_mm_add_epi16(vr, d0), s0);

        // Calculate squared error and add adjacent values
        const __m128i err0 = _mm_madd_epi16(e0, e0);

        sum32 = _mm_add_epi32(sum32, err0);
      }

      const __m128i sum32l = _mm_cvtepu32_epi64(sum32);
      sum64 = _mm_add_epi64(sum64, sum32l);
      const __m128i sum32h = _mm_cvtepu32_epi64(_mm_srli_si128(sum32, 8));
      sum64 = _mm_add_epi64(sum64, sum32h);

      // Process remaining pixels in this row (modulo 8)
      for (k = j; k < width; ++k) {
        const int32_t u = (int32_t)(dat[k] << SGRPROJ_RST_BITS);
        int32_t v = xq_on * (flt[k] - u);
        const int32_t e = ROUND_POWER_OF_TWO(v, shift) + dat[k] - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt += flt_stride;
    }
  } else {  // Neither filter is enabled
    for (i = 0; i < height; ++i) {
      __m128i sum32 = _mm_setzero_si128();
      for (j = 0; j <= width - 16; j += 16) {
        // Load 2x8 u16 from source image
        const __m128i s0 = xx_loadu_128(src + j);
        const __m128i s1 = xx_loadu_128(src + j + 8);
        // Load 2x8 u16 from corrupted image
        const __m128i d0 = xx_loadu_128(dat + j);
        const __m128i d1 = xx_loadu_128(dat + j + 8);

        // Subtract corrupted image from source image
        const __m128i diff0 = _mm_sub_epi16(d0, s0);
        const __m128i diff1 = _mm_sub_epi16(d1, s1);

        // Square error and add adjacent values
        const __m128i err0 = _mm_madd_epi16(diff0, diff0);
        const __m128i err1 = _mm_madd_epi16(diff1, diff1);

        sum32 = _mm_add_epi32(sum32, err0);
        sum32 = _mm_add_epi32(sum32, err1);
      }

      const __m128i sum32l = _mm_cvtepu32_epi64(sum32);
      sum64 = _mm_add_epi64(sum64, sum32l);
      const __m128i sum32h = _mm_cvtepu32_epi64(_mm_srli_si128(sum32, 8));
      sum64 = _mm_add_epi64(sum64, sum32h);

      // Process remaining pixels (modulu 8)
      for (k = j; k < width; ++k) {
        const int32_t e = (int32_t)(dat[k]) - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
    }
  }

  // Sum 4 values from sum64l and sum64h into err
  int64_t sum[2];
  xx_storeu_128(sum, sum64);
  err += sum[0] + sum[1];
  return err;
}